

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O0

void __thiscall FSkillInfo::FSkillInfo(FSkillInfo *this,FSkillInfo *other)

{
  FSkillInfo *other_local;
  FSkillInfo *this_local;
  
  FName::FName(&this->Name);
  FString::FString(&this->MenuName);
  FString::FString(&this->PicName);
  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::TMap
            (&this->MenuNamesForPlayerClass);
  FString::FString(&this->MustConfirmText);
  FString::FString(&this->TextColor);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::TMap(&this->Replace);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::TMap(&this->Replaced);
  operator=(this,other);
  return;
}

Assistant:

FSkillInfo(const FSkillInfo &other)
	{
		operator=(other);
	}